

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeArray::printRaw(TypeArray *this,ostream *s)

{
  ostream *poVar1;
  
  (*this->arrayof->_vptr_Datatype[3])();
  poVar1 = std::operator<<(s," [");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->arraysize);
  std::operator<<(poVar1,']');
  return;
}

Assistant:

void TypeArray::printRaw(ostream &s) const

{
  arrayof->printRaw(s);
  s << " [" << dec << arraysize << ']';
}